

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O0

void __thiscall
module_reverse_csv_actions::from_header(module_reverse_csv_actions *this,string *header)

{
  string *header_local;
  module_reverse_csv_actions *this_local;
  
  if ((this->first_header_ & 1U) == 0) {
    std::operator<<((ostream *)&std::cout,' ');
  }
  else {
    this->first_header_ = false;
  }
  std::operator<<((ostream *)&std::cout,(string *)header);
  return;
}

Assistant:

void from_header( std::string const & header )
    {
        if( first_header_ )
            first_header_ = false;
        else
            std::cout << ' ';
        std::cout << header;
    }